

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSolve.c
# Opt level: O3

void Cec_ObjAddToFrontier(Cec_ManSat_t *p,Gia_Obj_t *pObj,Vec_Ptr_t *vFrontier)

{
  uint uVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Gia_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSolve.c"
                  ,0x11b,"void Cec_ObjAddToFrontier(Cec_ManSat_t *, Gia_Obj_t *, Vec_Ptr_t *)");
  }
  pGVar3 = p->pAig->pObjs;
  if ((pGVar3 <= pObj) && (pObj < pGVar3 + p->pAig->nObjs)) {
    if ((p->pSatVars[(int)((ulong)((long)pObj - (long)pGVar3) >> 2) * -0x55555555] == 0) &&
       ((~*(ulong *)pObj & 0x1fffffff1fffffff) != 0)) {
      pVVar4 = p->vUsedNodes;
      uVar1 = pVVar4->nSize;
      if (uVar1 == pVVar4->nCap) {
        if ((int)uVar1 < 0x10) {
          if (pVVar4->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(pVVar4->pArray,0x80);
          }
          pVVar4->pArray = ppvVar5;
          pVVar4->nCap = 0x10;
        }
        else {
          if (pVVar4->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc((ulong)uVar1 << 4);
          }
          else {
            ppvVar5 = (void **)realloc(pVVar4->pArray,(ulong)uVar1 << 4);
          }
          pVVar4->pArray = ppvVar5;
          pVVar4->nCap = uVar1 * 2;
        }
      }
      else {
        ppvVar5 = pVVar4->pArray;
      }
      iVar2 = pVVar4->nSize;
      pVVar4->nSize = iVar2 + 1;
      ppvVar5[iVar2] = pObj;
      iVar2 = p->nSatVars;
      p->nSatVars = iVar2 + 1;
      pGVar3 = p->pAig->pObjs;
      if ((pObj < pGVar3) || (pGVar3 + p->pAig->nObjs <= pObj)) goto LAB_00659b99;
      p->pSatVars[(int)((ulong)((long)pObj - (long)pGVar3) >> 2) * -0x55555555] = iVar2;
      if ((~*(uint *)pObj & 0x1fffffff) != 0 && -1 < (int)*(uint *)pObj) {
        uVar1 = vFrontier->nSize;
        if (uVar1 == vFrontier->nCap) {
          if ((int)uVar1 < 0x10) {
            if (vFrontier->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc(0x80);
            }
            else {
              ppvVar5 = (void **)realloc(vFrontier->pArray,0x80);
            }
            vFrontier->pArray = ppvVar5;
            vFrontier->nCap = 0x10;
          }
          else {
            if (vFrontier->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc((ulong)uVar1 << 4);
            }
            else {
              ppvVar5 = (void **)realloc(vFrontier->pArray,(ulong)uVar1 << 4);
            }
            vFrontier->pArray = ppvVar5;
            vFrontier->nCap = uVar1 * 2;
          }
        }
        else {
          ppvVar5 = vFrontier->pArray;
        }
        iVar2 = vFrontier->nSize;
        vFrontier->nSize = iVar2 + 1;
        ppvVar5[iVar2] = pObj;
      }
    }
    return;
  }
LAB_00659b99:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Cec_ObjAddToFrontier( Cec_ManSat_t * p, Gia_Obj_t * pObj, Vec_Ptr_t * vFrontier )
{
    assert( !Gia_IsComplement(pObj) );
    if ( Cec_ObjSatNum(p,pObj) )
        return;
    assert( Cec_ObjSatNum(p,pObj) == 0 );
    if ( Gia_ObjIsConst0(pObj) )
        return;
    Vec_PtrPush( p->vUsedNodes, pObj );
    Cec_ObjSetSatNum( p, pObj, p->nSatVars++ );
    if ( Gia_ObjIsAnd(pObj) )
        Vec_PtrPush( vFrontier, pObj );
}